

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

void unscaleSolution(HighsSolution *solution,HighsScale *scale)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  long lVar5;
  
  iVar1 = scale->num_col;
  if (0 < (long)iVar1) {
    pdVar2 = (scale->col).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = pdVar2[lVar5] * pdVar3[lVar5];
      pdVar4[lVar5] = pdVar4[lVar5] / (pdVar2[lVar5] / scale->cost);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  iVar1 = scale->num_row;
  if (0 < (long)iVar1) {
    pdVar2 = (scale->row).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    do {
      pdVar3[lVar5] = pdVar3[lVar5] / pdVar2[lVar5];
      pdVar4[lVar5] = pdVar2[lVar5] * scale->cost * pdVar4[lVar5];
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return;
}

Assistant:

void unscaleSolution(HighsSolution& solution, const HighsScale& scale) {
  assert(solution.col_value.size() == static_cast<size_t>(scale.num_col));
  assert(solution.col_dual.size() == static_cast<size_t>(scale.num_col));
  assert(solution.row_value.size() == static_cast<size_t>(scale.num_row));
  assert(solution.row_dual.size() == static_cast<size_t>(scale.num_row));

  for (HighsInt iCol = 0; iCol < scale.num_col; iCol++) {
    solution.col_value[iCol] *= scale.col[iCol];
    solution.col_dual[iCol] /= (scale.col[iCol] / scale.cost);
  }
  for (HighsInt iRow = 0; iRow < scale.num_row; iRow++) {
    solution.row_value[iRow] /= scale.row[iRow];
    solution.row_dual[iRow] *= (scale.row[iRow] * scale.cost);
  }
}